

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString StringFromBinaryWithSize(uchar *value,size_t size)

{
  ulong in_RDX;
  SimpleString local_20;
  
  StringFromFormat((char *)value,"Size = %u | HexContents = ");
  StringFromBinaryOrNull((uchar *)&local_20,size);
  SimpleString::operator+=((SimpleString *)value,local_20.buffer_);
  SimpleString::~SimpleString(&local_20);
  if (0x80 < in_RDX) {
    SimpleString::operator+=((SimpleString *)value," ...");
  }
  return (SimpleString)(char *)value;
}

Assistant:

SimpleString StringFromBinaryWithSize(const unsigned char* value, size_t size)
{
    SimpleString result = StringFromFormat("Size = %u | HexContents = ", (unsigned) size);
    size_t displayedSize = ((size > 128) ? 128 : size);
    result += StringFromBinaryOrNull(value, displayedSize);
    if (size > displayedSize)
    {
        result += " ...";
    }
    return result;
}